

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O3

int cm_zlib_gzclose(gzFile file)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  gz_stream *s;
  ulong uVar4;
  
  if (file != (gzFile)0x0) {
    if (*(char *)((long)file + 0xac) == 'w') {
      iVar3 = 4;
      iVar2 = do_flush(file,4);
      if (iVar2 == 0) {
        pFVar1 = *(FILE **)((long)file + 0x78);
        uVar4 = *(ulong *)((long)file + 0x90);
        do {
          fputc((uint)uVar4 & 0xff,pFVar1);
          uVar4 = uVar4 >> 8;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        pFVar1 = *(FILE **)((long)file + 0x78);
        uVar4 = (ulong)*(uint *)((long)file + 0xb8);
        iVar2 = 4;
        do {
          fputc((uint)uVar4 & 0xff,pFVar1);
          uVar4 = uVar4 >> 8;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
    }
    iVar2 = destroy((gz_stream *)file);
    return iVar2;
  }
  return -2;
}

Assistant:

int ZEXPORT gzclose (file)
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL) return Z_STREAM_ERROR;

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        return Z_STREAM_ERROR;
#else
        if (do_flush (file, Z_FINISH) != Z_OK)
            return destroy((gz_stream*)file);

        putLong (s->file, s->crc);
        putLong (s->file, (uLong)(s->in & 0xffffffff));
#endif
    }
    return destroy((gz_stream*)file);
}